

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<unsigned_int,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (uint *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  ulong uVar6;
  Vector *result;
  ulong uVar7;
  ulong uVar8;
  char **ppcVar9;
  idx_t iVar10;
  ulong uVar11;
  string_t sVar12;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar9 = &(result_data->value).pointer.ptr;
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      sVar12 = StringCast::Operation<unsigned_int>(ldata[iVar10],(Vector *)dataptr);
      uVar4 = sVar12.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
      paVar1->length = (int)uVar4;
      paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
      *ppcVar9 = sVar12.value._8_8_;
      ppcVar9 = ppcVar9 + 2;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar7 = 0;
    for (uVar6 = 0; uVar6 != count + 0x3f >> 6; uVar6 = uVar6 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
LAB_01434d8e:
        ppcVar9 = &result_data[uVar7].value.pointer.ptr;
        for (; uVar5 = uVar7, uVar7 < uVar11; uVar7 = uVar7 + 1) {
          sVar12 = StringCast::Operation<unsigned_int>(ldata[uVar7],(Vector *)dataptr);
          uVar4 = sVar12.value._0_8_;
          paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
          paVar1->length = (int)uVar4;
          paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
          paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
          paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
          paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
          *ppcVar9 = sVar12.value._8_8_;
          ppcVar9 = ppcVar9 + 2;
        }
      }
      else {
        uVar3 = puVar2[uVar6];
        uVar11 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar11 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_01434d8e;
        uVar5 = uVar11;
        if (uVar3 != 0) {
          ppcVar9 = &result_data[uVar7].value.pointer.ptr;
          for (uVar8 = 0; uVar5 = uVar8 + uVar7, uVar8 + uVar7 < uVar11; uVar8 = uVar8 + 1) {
            if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
              sVar12 = StringCast::Operation<unsigned_int>(ldata[uVar7 + uVar8],(Vector *)dataptr);
              uVar4 = sVar12.value._0_8_;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar9 + -1);
              paVar1->length = (int)uVar4;
              paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
              paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
              paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
              paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
              *ppcVar9 = sVar12.value._8_8_;
            }
            ppcVar9 = ppcVar9 + 2;
          }
        }
      }
      uVar7 = uVar5;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}